

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_codegen.c
# Opt level: O0

void visit_variable_decl(gvisitor_t *self,gnode_variable_decl_t *node)

{
  gravity_function_t *f_00;
  gravity_vm *vm;
  long lVar1;
  long lVar2;
  gravity_value_t value;
  uint16_t uVar3;
  int iVar4;
  uint32_t uVar5;
  anon_union_8_3_4e90ac68_for_gravity_value_t_1 aVar6;
  ircode_t *piVar7;
  void *pvVar8;
  bool bVar9;
  bool bVar10;
  gravity_value_t gVar11;
  uint32_t local_174;
  long local_160;
  gravity_function_t *local_150;
  uint32_t local_144;
  uint32_t local_12c;
  uint32_t local_10c;
  uint32_t local_fc;
  gnode_var_t *local_e8;
  gnode_var_t *local_e0;
  uint32_t reg_2;
  ircode_t *code_2;
  anon_union_8_3_4e90ac68_for_gravity_value_t_1 local_b8;
  gravity_function_t *init_function;
  gravity_function_t *f;
  uint16_t ivar_index;
  gravity_class_t *context_class;
  _Bool is_static;
  uint32_t reg_1;
  uint16_t index;
  ircode_t *code_1;
  gravity_function_t *context_function_1;
  uint32_t reg;
  ircode_t *code;
  gravity_function_t *context_function;
  gnode_var_t *p;
  size_t i;
  size_t count;
  _Bool is_local;
  _Bool is_class;
  _Bool is_module;
  gravity_object_t *context_object;
  gnode_variable_decl_t *node_local;
  gvisitor_t *self_local;
  
  f_00 = *(gravity_function_t **)(*(long *)((long)self->data + 0x10) + (*self->data + -1) * 8);
  if (node->storage != TOK_KEY_EXTERN) {
    bVar9 = false;
    if (f_00->isa == gravity_class_function) {
      iVar4 = string_cmp(f_00->identifier,"$moduleinit");
      bVar9 = iVar4 == 0;
    }
    bVar10 = f_00->isa != gravity_class_class;
    if (node->decls == (gnode_r *)0x0) {
      local_e0 = (gnode_var_t *)0x0;
    }
    else {
      local_e0 = (gnode_var_t *)node->decls->n;
    }
    for (p = (gnode_var_t *)0x0; p < local_e0; p = (gnode_var_t *)((long)&(p->base).tag + 1)) {
      if (p < (gnode_var_t *)node->decls->n) {
        local_e8 = (gnode_var_t *)node->decls->p[(long)p];
      }
      else {
        local_e8 = (gnode_var_t *)0x0;
      }
      if (bVar9 || !bVar10) {
        if (bVar9) {
          piVar7 = (ircode_t *)(f_00->field_9).field_0.bytecode;
          vm = *(gravity_vm **)((long)self->data + 0x38);
          gVar11 = gravity_string_to_value((gravity_vm *)0x0,local_e8->identifier,0xffffffff);
          uVar3 = gravity_function_cpool_add(vm,f_00,gVar11);
          if (local_e8->expr == (gnode_t *)0x0) {
            if (node == (gnode_variable_decl_t *)0x0) {
              local_12c = 0;
            }
            else {
              local_12c = (node->base).token.lineno;
            }
            ircode_add_constant(piVar7,0x1002,local_12c);
          }
          else {
            gvisit(self,local_e8->expr);
          }
          uVar5 = ircode_register_pop(piVar7);
          if (uVar5 == 0xffffffff) {
            report_error(self,&node->base,"Invalid var expression.");
          }
          if (node == (gnode_variable_decl_t *)0x0) {
            local_144 = 0;
          }
          else {
            local_144 = (node->base).token.lineno;
          }
          ircode_add(piVar7,STOREG,uVar5,(uint)uVar3,0,local_144);
        }
        else {
          if (bVar10) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/marcobambini[P]gravity/src/compiler/gravity_codegen.c"
                          ,0x4e9,"void visit_variable_decl(gvisitor_t *, gnode_variable_decl_t *)");
          }
          local_150 = f_00;
          if (node->storage == TOK_KEY_STATIC) {
            local_150 = (gravity_function_t *)f_00->xdata;
          }
          if ((local_e8->expr == (gnode_t *)0x0) || ((local_e8->iscomputed & 1U) == 0)) {
            if (node->access == TOK_KEY_PUBLIC) {
              aVar6.p = (gravity_object_t *)
                        gravity_function_new_special
                                  ((gravity_vm *)0x0,(char *)0x0,local_e8->index,(void *)0x0,
                                   (void *)0x0);
              gVar11.field_1.p = (gravity_object_t *)aVar6.n;
              gVar11.isa = (aVar6.p)->isa;
              gravity_class_bind((gravity_class_t *)local_150,local_e8->identifier,gVar11);
            }
            if (local_e8->expr != (gnode_t *)0x0) {
              local_b8.p = (gravity_object_t *)
                           class_lookup_nosuper((gravity_class_t *)local_150,"$init");
              if (local_b8.n == 0) {
                piVar7 = ircode_create(1);
                local_b8.p = (gravity_object_t *)
                             gravity_function_new((gravity_vm *)0x0,"$init",1,0,0,piVar7);
                value.field_1.p = (gravity_object_t *)local_b8.n;
                value.isa = (local_b8.p)->isa;
                gravity_class_bind((gravity_class_t *)local_150,"$init",value);
              }
              if (*self->data == *(long *)((long)self->data + 8)) {
                if (*(long *)((long)self->data + 8) == 0) {
                  local_160 = 8;
                }
                else {
                  local_160 = *(long *)((long)self->data + 8) << 1;
                }
                *(long *)((long)self->data + 8) = local_160;
                pvVar8 = realloc(*(void **)((long)self->data + 0x10),
                                 *(long *)((long)self->data + 8) << 3);
                *(void **)((long)self->data + 0x10) = pvVar8;
              }
              lVar1 = *(long *)((long)self->data + 0x10);
              lVar2 = *self->data;
              *(long *)self->data = lVar2 + 1;
              ((anon_union_8_3_4e90ac68_for_gravity_value_t_1 *)(lVar1 + lVar2 * 8))->p =
                   (gravity_object_t *)local_b8;
              piVar7 = *(ircode_t **)(local_b8.n + 0xa0);
              gvisit(self,local_e8->expr);
              uVar5 = ircode_register_pop(piVar7);
              if (uVar5 == 0xffffffff) {
                report_error(self,&node->base,"Invalid var expression.");
              }
              if (node == (gnode_variable_decl_t *)0x0) {
                local_174 = 0;
              }
              else {
                local_174 = (node->base).token.lineno;
              }
              ircode_add(piVar7,STORE,uVar5,0,local_e8->index + 0x100,local_174);
              *(long *)self->data = *self->data + -1;
            }
          }
          else {
            process_getter_setter(self,local_e8,(gravity_class_t *)local_150);
          }
        }
      }
      else if ((local_e8->expr == (gnode_t *)0x0) || (local_e8->expr->tag != NODE_ENUM_DECL)) {
        if (local_e8->expr != (gnode_t *)0x0) {
          gvisit(self,local_e8->expr);
        }
        piVar7 = (ircode_t *)(f_00->field_9).field_0.bytecode;
        if (local_e8->expr == (gnode_t *)0x0) {
          if (node == (gnode_variable_decl_t *)0x0) {
            local_10c = 0;
          }
          else {
            local_10c = (node->base).token.lineno;
          }
          ircode_add(piVar7,LOADK,(uint)local_e8->index,0x1002,0,local_10c);
        }
        else {
          uVar5 = ircode_register_pop(piVar7);
          if (uVar5 == 0xffffffff) {
            report_error(self,&node->base,"Invalid var expression.");
          }
          if (node == (gnode_variable_decl_t *)0x0) {
            local_fc = 0;
          }
          else {
            local_fc = (node->base).token.lineno;
          }
          ircode_add(piVar7,MOVE,(uint)local_e8->index,uVar5,0,local_fc);
          ircode_add_check(piVar7);
        }
      }
    }
  }
  return;
}

Assistant:

static void visit_variable_decl (gvisitor_t *self, gnode_variable_decl_t *node) {
    DEBUG_CODEGEN("visit_variable_decl");
    DECLARE_CONTEXT();

    // no initialization for extern variables since the real value will be provided at runtime
    if (node->storage == TOK_KEY_EXTERN) return;

    bool is_module = CONTEXT_IS_MODULE(context_object);
    bool is_class = OBJECT_ISA_CLASS(context_object);
    bool is_local = ((is_module == false) && (is_class == false));

    // loop through declarations
    size_t count = gnode_array_size(node->decls);
    for (size_t i=0; i<count; ++i) {
        gnode_var_t *p = (gnode_var_t *)gnode_array_get(node->decls, i);
        DEBUG_CODEGEN("visit_variable_decl %s", p->identifier);

        // variable declarations can be specified in:
        // FUNCTION (local variable)
        // MODULE (module variable)
        // CLASS (property)

        if (is_local) {
            // it is a local variable declaration (default initialized to NULL)
            // code is generate ONLY if an init expression is specified
            //
            //    example:
            //
            //    func foo () {
            //        var a = 10;
            //    }
            //
            //    LOADI    1 10    ; move 10 into register 1
            //    MOVE    0 1        ; move register 1 into register 0
            //

            // generate expression code (if it is not a local enum)
            if (NODE_ISA(p->expr, NODE_ENUM_DECL)) continue;
            if (p->expr) visit(p->expr); // context is a function

            gravity_function_t *context_function = (gravity_function_t *)context_object;
            ircode_t *code = (ircode_t *)context_function->bytecode;
            if (p->expr) {
                // assign to variable result of the expression
                uint32_t reg = ircode_register_pop(code);
                if (reg == REGISTER_ERROR) report_error(self, (gnode_t *)node, "Invalid var expression.");
				ircode_add(code, MOVE, p->index, reg, 0, LINE_NUMBER(node));
                // Checkpoint added to support STRUCT
                ircode_add_check(code);
            } else {
                // no default assignment expression found so initialize to NULL
				ircode_add(code, LOADK, p->index, CPOOL_VALUE_NULL, 0, LINE_NUMBER(node));
            }
            continue;
        }

        if (is_module) {
            // it is a module variable (default initialized to null)
            // code must ALWAYS be generated
            //
            // example 1:
            //    var a;
            //
            //    LOADK    0 NULL   ; move null into register 0
            //    STOREG    0 0     ; move register 0 into hash(constant_pool(0))
            //
            // example 2:
            //    var a = 10;
            //
            //    LOADI    0 10     ; move 10 into register 0
            //    STOREG    0 0     ; move register 0 into hash(constant_pool(0))
            //

            gravity_function_t *context_function = (gravity_function_t *)context_object;
            ircode_t *code = (ircode_t *)context_function->bytecode;
            uint16_t index = gravity_function_cpool_add(GET_VM(), context_function, VALUE_FROM_CSTRING(NULL, p->identifier));

            if (p->expr) {
                visit(p->expr); // context is a function
            } else {
				ircode_add_constant(code, CPOOL_VALUE_NULL, LINE_NUMBER(node));
            }
            uint32_t reg = ircode_register_pop(code);
            if (reg == REGISTER_ERROR) report_error(self, (gnode_t *)node, "Invalid var expression.");
			ircode_add(code, STOREG, reg, index, 0, LINE_NUMBER(node));
            continue;
        }

        if (is_class) {
            bool is_static = (node->storage == TOK_KEY_STATIC);
            gravity_class_t *context_class = (is_static) ? ((gravity_class_t *)context_object)->objclass : (gravity_class_t *)context_object;

            // check computed property case first
            if ((p->expr) && (p->iscomputed)) {
                process_getter_setter(self, p, context_class);
                continue;
            }

            // create ivar first
            uint16_t ivar_index = (p->index >= 0) ? p->index : gravity_class_add_ivar(context_class, NULL);

            // add default getter and setter ONLY if property is public
            if (node->access == TOK_KEY_PUBLIC) {
                // since getter and setter are methods and not simple functions, do not transfer to VM
                gravity_function_t *f = gravity_function_new_special(NULL, NULL, ivar_index, NULL, NULL); // getter and setter NULL means default
                gravity_class_bind(context_class, p->identifier, VALUE_FROM_OBJECT(f));
            }
            DEBUG_CODEGEN("Class: %s (static: %d) property: %s index: %d", context_class->identifier, is_static, p->identifier, ivar_index);

            // it is a property (default initialized to null)
            // code must be generated ONLY if an init expression is specified

            //
            //  example:
            //     class foo {
            //         var a = 10;
            //     }
            //
            //  get $init function
            //  depending if variable has been created static
            //  and push it as current declaration then:
            //
            //     LOADI     0 10   ; move 10 into register 0
            //     STOREF    0 0    ; move register 0 into property 0

            if (p->expr) {
                // was gravity_class_lookup but that means than $init or init will be recursively searched also in super classes
                gravity_function_t *init_function = class_lookup_nosuper(context_class, CLASS_INTERNAL_INIT_NAME);
                if (init_function == NULL) {
                    // no $init method found so create a new one
                    init_function = gravity_function_new (NULL, CLASS_INTERNAL_INIT_NAME, 1, 0, 0, ircode_create(1));
                    gravity_class_bind(context_class, CLASS_INTERNAL_INIT_NAME, VALUE_FROM_OBJECT(init_function));
                }

                CONTEXT_PUSH(init_function);
                ircode_t *code = (ircode_t *)init_function->bytecode;
                visit(p->expr);
                uint32_t reg = ircode_register_pop(code);
                if (reg == REGISTER_ERROR) report_error(self, (gnode_t *)node, "Invalid var expression.");
				ircode_add(code, STORE, reg, 0, p->index + MAX_REGISTERS, LINE_NUMBER(node));
                CONTEXT_POP();
            }

            continue;
        }

        // should never reach this point
        assert(0);
    }
}